

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int secp256r1_key_exchange(ptls_iovec_t *pubkey,ptls_iovec_t *secret,ptls_iovec_t peerkey)

{
  undefined8 uVar1;
  int iVar2;
  uECC_Curve puVar3;
  ptls_iovec_t pVar4;
  uint8_t *local_80;
  size_t local_78;
  uint8_t *local_70;
  size_t local_68;
  int local_5c;
  uint8_t *puStack_58;
  int ret;
  uint8_t *secbytes;
  uint8_t *pub;
  uint8_t priv [32];
  ptls_iovec_t *secret_local;
  ptls_iovec_t *pubkey_local;
  ptls_iovec_t peerkey_local;
  
  secbytes = (uint8_t *)0x0;
  puStack_58 = (uint8_t *)0x0;
  priv._24_8_ = secret;
  if ((peerkey.len == 0x41) && (*peerkey.base == '\x04')) {
    secbytes = (uint8_t *)malloc(0x41);
    if (secbytes == (uint8_t *)0x0) {
      local_5c = 0x201;
    }
    else {
      puStack_58 = (uint8_t *)malloc(0x20);
      if (puStack_58 == (uint8_t *)0x0) {
        local_5c = 0x201;
      }
      else {
        *secbytes = '\x04';
        puVar3 = uECC_secp256r1();
        uECC_make_key(secbytes + 1,(uint8_t *)&pub,puVar3);
        puVar3 = uECC_secp256r1();
        iVar2 = uECC_shared_secret(peerkey.base + 1,(uint8_t *)&pub,puStack_58,puVar3);
        if (iVar2 == 0) {
          local_5c = 0x33;
        }
        else {
          pVar4 = ptls_iovec_init(secbytes,0x41);
          uVar1 = priv._24_8_;
          local_70 = pVar4.base;
          pubkey->base = local_70;
          local_68 = pVar4.len;
          pubkey->len = local_68;
          pVar4 = ptls_iovec_init(puStack_58,0x20);
          local_80 = pVar4.base;
          *(uint8_t **)uVar1 = local_80;
          local_78 = pVar4.len;
          *(size_t *)(uVar1 + 8) = local_78;
          local_5c = 0;
        }
      }
    }
  }
  else {
    local_5c = 0x33;
  }
  (*ptls_clear_memory)(&pub,0x20);
  if (local_5c != 0) {
    free(puStack_58);
    free(secbytes);
  }
  return local_5c;
}

Assistant:

static int secp256r1_key_exchange(ptls_iovec_t *pubkey, ptls_iovec_t *secret, ptls_iovec_t peerkey)
{
    return secp_key_exchange(NID_X9_62_prime256v1, pubkey, secret, peerkey);
}